

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

XMLSize_t xercesc_4_0::XMLString::hash(char *tohash,XMLSize_t hashModulus)

{
  XMLSize_t top;
  char *curCh;
  XMLSize_t hashVal;
  XMLSize_t hashModulus_local;
  char *tohash_local;
  
  curCh = (char *)0x0;
  top = (XMLSize_t)tohash;
  if (tohash != (char *)0x0) {
    for (; *(char *)top != '\0'; top = top + 1) {
      curCh = (char *)((long)curCh * 0x26 + ((ulong)curCh >> 0x18) + (long)*(char *)top);
    }
  }
  return (ulong)curCh % hashModulus;
}

Assistant:

XMLSize_t XMLString::hash(   const   char* const    tohash
                            , const XMLSize_t       hashModulus)
{
    XMLSize_t hashVal = 0;
    if (tohash) {
        const char* curCh = tohash;
        while (*curCh)
        {
            XMLSize_t top = hashVal >> 24;
            hashVal += (hashVal * 37) + top + (XMLSize_t)(*curCh);
            curCh++;
        }
    }

    // Divide by modulus
    return hashVal % hashModulus;
}